

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int gzrewind(gzFile file)

{
  uLong uVar1;
  z_streamp in_RDI;
  gz_stream *s;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((in_RDI == (z_streamp)0x0) || (*(char *)((long)&in_RDI[1].state + 4) != 'r')) {
    iVar2 = -1;
  }
  else {
    *(undefined4 *)&in_RDI[1].next_in = 0;
    *(undefined4 *)((long)&in_RDI[1].next_in + 4) = 0;
    in_RDI[1].data_type = -1;
    in_RDI->avail_in = 0;
    in_RDI->next_in = (Bytef *)in_RDI[1].total_in;
    uVar1 = crc32(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(uchar *)in_RDI,
                  (uint)((ulong)in_RDI >> 0x20));
    *(uLong *)&in_RDI[1].avail_out = uVar1;
    if (*(int *)&in_RDI[1].state == 0) {
      inflateReset(in_RDI);
    }
    in_RDI[1].zfree = (free_func)0x0;
    in_RDI[1].opaque = (voidpf)0x0;
    iVar2 = fseek(*(FILE **)&in_RDI[1].avail_in,(long)in_RDI[1].zalloc,0);
  }
  return iVar2;
}

Assistant:

int ZEXPORT gzrewind (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'r') return -1;

    s->z_err = Z_OK;
    s->z_eof = 0;
    s->back = EOF;
    s->stream.avail_in = 0;
    s->stream.next_in = s->inbuf;
    s->crc = crc32(0L, Z_NULL, 0);
    if (!s->transparent) (void)inflateReset(&s->stream);
    s->in = 0;
    s->out = 0;
    return fseek(s->file, s->start, SEEK_SET);
}